

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall FastPForLib::FastPFor<8U>::~FastPFor(FastPFor<8U> *this)

{
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001ba9c0;
  FastPForImpl<8U,_unsigned_long>::~FastPForImpl(&this->pfor64);
  FastPForImpl<8U,_unsigned_int>::~FastPForImpl(&this->pfor32);
  return;
}

Assistant:

FastPFor(uint32_t pageSize = 65536) : pfor32(pageSize) {}